

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O1

int callback(char *filepath,coda_filefilter_status status,char *error,void *userdata)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char *__format;
  coda_product *pf;
  coda_cursor local_328;
  
  uVar3 = 0;
  switch(status) {
  case coda_ffs_error:
    __format = "ERROR: %s for %s\n";
    pcVar2 = filepath;
    break;
  case coda_ffs_could_not_open_file:
    __format = "ERROR: could not open file %s (%s)\n";
    pcVar2 = error;
    error = filepath;
    break;
  case coda_ffs_could_not_access_directory:
    fprintf(_stderr,"ERROR: unable to access directory %s\n",filepath);
    goto LAB_00101711;
  default:
    goto switchD_0010163b_caseD_3;
  case coda_ffs_match:
    goto switchD_0010163b_caseD_4;
  }
  fprintf(_stderr,__format,error,pcVar2);
LAB_00101711:
  uVar3 = 0;
  if (status == coda_ffs_match) {
switchD_0010163b_caseD_4:
    iVar1 = coda_open(filepath);
    uVar3 = 1;
    if (iVar1 == 0) {
      iVar1 = coda_cursor_set_product(&local_328,0);
      if (iVar1 == 0) {
        if ((node_expr == (coda_expression *)0x0) ||
           (iVar1 = coda_expression_eval_node(node_expr,&local_328), iVar1 == 0)) {
          iVar1 = eval_expression(&local_328);
          if (iVar1 != 0) {
            callback_cold_2();
          }
          iVar1 = coda_close(0);
          uVar3 = (uint)(iVar1 != 0);
        }
        else {
          callback_cold_1();
          uVar3 = 0;
        }
      }
      else {
        coda_close(0);
      }
    }
  }
switchD_0010163b_caseD_3:
  return uVar3;
}

Assistant:

int callback(const char *filepath, coda_filefilter_status status, const char *error, void *userdata)
{
    (void)userdata;     /* prevent unused warning */

    if (status == coda_ffs_error)
    {
        fprintf(stderr, "ERROR: %s for %s\n", error, filepath);
    }
    else if (status == coda_ffs_could_not_access_directory)
    {
        fprintf(stderr, "ERROR: unable to access directory %s\n", filepath);
    }
    else if (status == coda_ffs_could_not_open_file)
    {
        fprintf(stderr, "ERROR: could not open file %s (%s)\n", filepath, error);
    }
    if (status == coda_ffs_match)
    {
        return eval_expression_for_file(filepath);
    }

    return 0;
}